

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

int c2mir_compile(MIR_context_t ctx,c2mir_options *ops,_func_int_void_ptr *getc_func,void *getc_data
                 ,char *source_name,FILE *output_file)

{
  uint uVar1;
  c2m_ctx_t c2m_ctx_00;
  FILE *pFVar2;
  int iVar3;
  c2m_ctx_t *ppcVar4;
  node_t_conflict r_00;
  char *name;
  MIR_module_t_conflict module;
  code *pcVar5;
  double dVar6;
  double dVar7;
  MIR_module_t m;
  uint n_error_before;
  node_t_conflict r;
  double start_time;
  c2m_ctx *c2m_ctx;
  FILE *output_file_local;
  char *source_name_local;
  void *getc_data_local;
  _func_int_void_ptr *getc_func_local;
  c2mir_options *ops_local;
  MIR_context_t ctx_local;
  
  ppcVar4 = c2m_ctx_loc(ctx);
  c2m_ctx_00 = *ppcVar4;
  dVar6 = real_usec_time();
  if (c2m_ctx_00 == (c2m_ctx_t)0x0) {
    ctx_local._4_4_ = 0;
  }
  else {
    iVar3 = _setjmp((__jmp_buf_tag *)c2m_ctx_00->env);
    if (iVar3 == 0) {
      compile_init(c2m_ctx_00,ops,getc_func,getc_data);
      if ((c2m_ctx_00->options->verbose_p != 0) &&
         (c2m_ctx_00->options->message_file != (FILE *)0x0)) {
        pFVar2 = (FILE *)c2m_ctx_00->options->message_file;
        dVar7 = real_usec_time();
        fprintf(pFVar2,"C2MIR init end           -- %.0f usec\n",dVar7 - dVar6);
      }
      add_stream(c2m_ctx_00,(FILE *)0x0,source_name,top_level_getc);
      if (c2m_ctx_00->options->no_prepro_p == 0) {
        add_standard_includes(c2m_ctx_00);
      }
      pre(c2m_ctx_00);
      if ((c2m_ctx_00->options->verbose_p != 0) &&
         (c2m_ctx_00->options->message_file != (FILE *)0x0)) {
        pFVar2 = (FILE *)c2m_ctx_00->options->message_file;
        dVar7 = real_usec_time();
        fprintf(pFVar2,"  C2MIR preprocessor end    -- %.0f usec\n",dVar7 - dVar6);
      }
      if (c2m_ctx_00->options->prepro_only_p == 0) {
        r_00 = parse(c2m_ctx_00);
        if ((c2m_ctx_00->options->verbose_p != 0) &&
           (c2m_ctx_00->options->message_file != (FILE *)0x0)) {
          pFVar2 = (FILE *)c2m_ctx_00->options->message_file;
          dVar7 = real_usec_time();
          fprintf(pFVar2,"  C2MIR parser end          -- %.0f usec\n",dVar7 - dVar6);
        }
        if (((c2m_ctx_00->options->verbose_p != 0) &&
            (c2m_ctx_00->options->message_file != (FILE *)0x0)) && (c2m_ctx_00->n_errors != 0)) {
          fprintf((FILE *)c2m_ctx_00->options->message_file,"parser - FAIL\n");
        }
        if (c2m_ctx_00->options->syntax_only_p == 0) {
          uVar1 = c2m_ctx_00->n_errors;
          do_context(c2m_ctx_00,r_00);
          if (uVar1 < c2m_ctx_00->n_errors) {
            if (c2m_ctx_00->options->debug_p != 0) {
              print_node(c2m_ctx_00,c2m_ctx_00->options->message_file,r_00,0,0);
            }
            if ((c2m_ctx_00->options->verbose_p != 0) &&
               (c2m_ctx_00->options->message_file != (FILE *)0x0)) {
              fprintf((FILE *)c2m_ctx_00->options->message_file,"C2MIR context checker - FAIL\n");
            }
          }
          else {
            if (c2m_ctx_00->options->debug_p != 0) {
              print_node(c2m_ctx_00,c2m_ctx_00->options->message_file,r_00,0,1);
            }
            if ((c2m_ctx_00->options->verbose_p != 0) &&
               (c2m_ctx_00->options->message_file != (FILE *)0x0)) {
              pFVar2 = (FILE *)c2m_ctx_00->options->message_file;
              dVar7 = real_usec_time();
              fprintf(pFVar2,"  C2MIR context checker end -- %.0f usec\n",dVar7 - dVar6);
            }
            name = get_module_name(c2m_ctx_00);
            module = MIR_new_module(ctx,name);
            gen_mir(c2m_ctx_00,r_00);
            if (((c2m_ctx_00->options->asm_p != 0) || (c2m_ctx_00->options->object_p != 0)) &&
               (c2m_ctx_00->n_errors == 0)) {
              iVar3 = strcmp(source_name,"<command-line>");
              if (iVar3 == 0) {
                MIR_output_module(ctx,c2m_ctx_00->options->message_file,module);
              }
              else if (output_file != (FILE *)0x0) {
                pcVar5 = MIR_write_module;
                if (c2m_ctx_00->options->asm_p != 0) {
                  pcVar5 = MIR_output_module;
                }
                (*pcVar5)(ctx,output_file,module);
                iVar3 = ferror((FILE *)output_file);
                if ((iVar3 != 0) || (iVar3 = fclose((FILE *)output_file), iVar3 != 0)) {
                  fprintf((FILE *)c2m_ctx_00->options->message_file,
                          "C2MIR error in writing mir for source file %s\n",source_name);
                  c2m_ctx_00->n_errors = c2m_ctx_00->n_errors + 1;
                }
              }
            }
            MIR_finish_module(ctx);
            if ((c2m_ctx_00->options->verbose_p != 0) &&
               (c2m_ctx_00->options->message_file != (FILE *)0x0)) {
              pFVar2 = (FILE *)c2m_ctx_00->options->message_file;
              dVar7 = real_usec_time();
              fprintf(pFVar2,"  C2MIR generator end       -- %.0f usec\n",dVar7 - dVar6);
            }
          }
        }
      }
      compile_finish(c2m_ctx_00);
      if ((c2m_ctx_00->options->verbose_p != 0) &&
         (c2m_ctx_00->options->message_file != (FILE *)0x0)) {
        pFVar2 = (FILE *)c2m_ctx_00->options->message_file;
        dVar7 = real_usec_time();
        fprintf(pFVar2,"C2MIR compiler end                -- %.0f usec\n",dVar7 - dVar6);
      }
      ctx_local._4_4_ = (uint)(c2m_ctx_00->n_errors == 0);
    }
    else {
      compile_finish(c2m_ctx_00);
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int c2mir_compile (MIR_context_t ctx, struct c2mir_options *ops, int (*getc_func) (void *),
                   void *getc_data, const char *source_name, FILE *output_file) {
  struct c2m_ctx *c2m_ctx = *c2m_ctx_loc (ctx);
  double start_time = real_usec_time ();
  node_t r;
  unsigned n_error_before;
  MIR_module_t m;

  if (c2m_ctx == NULL) return 0;
  if (setjmp (c2m_ctx->env)) {
    compile_finish (c2m_ctx);
    return 0;
  }
  compile_init (c2m_ctx, ops, getc_func, getc_data);
  if (c2m_options->verbose_p && c2m_options->message_file != NULL)
    fprintf (c2m_options->message_file, "C2MIR init end           -- %.0f usec\n",
             real_usec_time () - start_time);
  add_stream (c2m_ctx, NULL, source_name, top_level_getc);
  if (!c2m_options->no_prepro_p) add_standard_includes (c2m_ctx);
  pre (c2m_ctx);
  if (c2m_options->verbose_p && c2m_options->message_file != NULL)
    fprintf (c2m_options->message_file, "  C2MIR preprocessor end    -- %.0f usec\n",
             real_usec_time () - start_time);
  if (!c2m_options->prepro_only_p) {
    r = parse (c2m_ctx);
    if (c2m_options->verbose_p && c2m_options->message_file != NULL)
      fprintf (c2m_options->message_file, "  C2MIR parser end          -- %.0f usec\n",
               real_usec_time () - start_time);
    if (c2m_options->verbose_p && c2m_options->message_file != NULL && n_errors)
      fprintf (c2m_options->message_file, "parser - FAIL\n");
    if (!c2m_options->syntax_only_p) {
      n_error_before = n_errors;
      do_context (c2m_ctx, r);
      if (n_errors > n_error_before) {
        if (c2m_options->debug_p) print_node (c2m_ctx, c2m_options->message_file, r, 0, FALSE);
        if (c2m_options->verbose_p && c2m_options->message_file != NULL)
          fprintf (c2m_options->message_file, "C2MIR context checker - FAIL\n");
      } else {
        if (c2m_options->debug_p) print_node (c2m_ctx, c2m_options->message_file, r, 0, TRUE);
        if (c2m_options->verbose_p && c2m_options->message_file != NULL)
          fprintf (c2m_options->message_file, "  C2MIR context checker end -- %.0f usec\n",
                   real_usec_time () - start_time);
        m = MIR_new_module (ctx, get_module_name (c2m_ctx));
        gen_mir (c2m_ctx, r);
        if ((c2m_options->asm_p || c2m_options->object_p) && n_errors == 0) {
          if (strcmp (source_name, COMMAND_LINE_SOURCE_NAME) == 0) {
            MIR_output_module (ctx, c2m_options->message_file, m);
          } else if (output_file != NULL) {
            (c2m_options->asm_p ? MIR_output_module : MIR_write_module) (ctx, output_file, m);
            if (ferror (output_file) || fclose (output_file)) {
              fprintf (c2m_options->message_file, "C2MIR error in writing mir for source file %s\n",
                       source_name);
              n_errors++;
            }
          }
        }
        MIR_finish_module (ctx);
        if (c2m_options->verbose_p && c2m_options->message_file != NULL)
          fprintf (c2m_options->message_file, "  C2MIR generator end       -- %.0f usec\n",
                   real_usec_time () - start_time);
      }
    }
  }
  compile_finish (c2m_ctx);
  if (c2m_options->verbose_p && c2m_options->message_file != NULL)
    fprintf (c2m_options->message_file, "C2MIR compiler end                -- %.0f usec\n",
             real_usec_time () - start_time);
  return n_errors == 0;
}